

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O2

MDDEntry * __thiscall ASDCP::Dictionary::Type(Dictionary *this,MDD_t type_id)

{
  const_iterator cVar1;
  ILogSink *this_00;
  key_type local_14;
  
  if (*this->m_MDD_Table[0].name != '\0') {
    cVar1 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_ASDCP::UL>,_std::_Select1st<std::pair<const_unsigned_int,_ASDCP::UL>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ASDCP::UL>_>_>
            ::find(&(this->m_md_rev_lookup)._M_t,&local_14);
    if ((_Rb_tree_header *)cVar1._M_node ==
        &(this->m_md_rev_lookup)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Warn(this_00,"UL Dictionary: unknown UL type_id: %d\n",(ulong)type_id);
    }
    return this->m_MDD_Table + type_id;
  }
  __assert_fail("m_MDD_Table[0].name[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                ,0x116,"const ASDCP::MDDEntry &ASDCP::Dictionary::Type(MDD_t) const");
}

Assistant:

const ASDCP::MDDEntry&
ASDCP::Dictionary::Type(MDD_t type_id) const
{
  assert(m_MDD_Table[0].name[0]);
  std::map<ui32_t, ASDCP::UL>::const_iterator rii = m_md_rev_lookup.find(type_id);

  if ( rii == m_md_rev_lookup.end() )
    Kumu::DefaultLogSink().Warn("UL Dictionary: unknown UL type_id: %d\n", type_id);

  return m_MDD_Table[type_id];
}